

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# namingConventions.cpp
# Opt level: O0

string * namingConventions::findClassName(string *__return_storage_ptr__,string *word)

{
  ulong uVar1;
  char *pcVar2;
  uint local_20;
  uint c;
  string *word_local;
  string *name;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  local_20 = 0;
  while ((uVar1 = std::__cxx11::string::size(), local_20 < uVar1 &&
         (pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)word), *pcVar2 != '{'))) {
    std::__cxx11::string::operator[]((ulong)word);
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
    local_20 = local_20 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

std::string namingConventions::findClassName(std::string &word) {
    std::string name;
    for (unsigned int c = 0; c < word.size(); ++c) {
        if (word[c] != '{') {
            name.push_back(word[c]);
        } else {
            return name;
        }
    }
    return name;
}